

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# whisper.cpp
# Opt level: O0

void whisper_exp_compute_token_level_timestamps
               (whisper_context *ctx,whisper_state *state,int i_segment,float thold_pt,
               float thold_ptsum)

{
  double dVar1;
  long lVar2;
  whisper_token wVar3;
  int iVar4;
  size_type sVar5;
  reference pvVar6;
  long lVar7;
  reference pvVar8;
  long *plVar9;
  int *piVar10;
  reference pvVar11;
  int64_t iVar12;
  int in_EDX;
  long in_RSI;
  whisper_context *in_RDI;
  bool bVar13;
  float in_XMM0_Da;
  float fVar14;
  float in_XMM1_Da;
  int k_2;
  int k_1;
  float thold;
  int k;
  float sum;
  int ns;
  int ss1;
  int ss0;
  int s1;
  int s0;
  int j_4;
  int hw;
  int j_3;
  double ct;
  int j_2;
  double dt;
  int j_1;
  double psum;
  int p1;
  int p0;
  int64_t tt;
  value_type *token;
  int j;
  whisper_token *tid_last;
  int64_t *t_last;
  int64_t *t_beg;
  int n;
  int64_t t1;
  int64_t t0;
  int n_samples;
  vector<whisper_token_data,_std::allocator<whisper_token_data>_> *tokens;
  value_type *segment;
  int64_t in_stack_fffffffffffffd88;
  undefined7 in_stack_fffffffffffffd90;
  undefined1 in_stack_fffffffffffffd97;
  undefined7 in_stack_fffffffffffffdb0;
  undefined1 in_stack_fffffffffffffdb7;
  undefined7 in_stack_fffffffffffffdc0;
  undefined1 in_stack_fffffffffffffdc7;
  char *in_stack_fffffffffffffdc8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffdd0;
  int local_128;
  int local_124;
  int local_11c;
  float local_118;
  int local_110;
  int local_10c;
  int local_108;
  int local_104;
  int local_100;
  int local_fc;
  int local_f8;
  int local_f4;
  undefined4 local_f0;
  int local_ec;
  double local_e8;
  int local_dc;
  double local_d8;
  int local_cc;
  double local_c8;
  int local_bc;
  int local_b8;
  allocator<char> local_a1;
  string local_a0 [32];
  long local_80;
  reference local_78;
  int local_6c;
  int *local_68;
  long *local_60;
  long *local_58;
  int local_4c;
  long local_48;
  long local_40;
  int local_34;
  vector<whisper_token_data,_std::allocator<whisper_token_data>_> *local_30;
  reference local_28;
  float local_1c;
  float local_18;
  long local_10;
  whisper_context *local_8;
  
  local_1c = in_XMM1_Da;
  local_18 = in_XMM0_Da;
  local_10 = in_RSI;
  local_8 = in_RDI;
  local_28 = std::vector<whisper_segment,_std::allocator<whisper_segment>_>::operator[]
                       ((vector<whisper_segment,_std::allocator<whisper_segment>_> *)
                        (in_RSI + 0xa660),(long)in_EDX);
  local_30 = &local_28->tokens;
  sVar5 = std::vector<float,_std::allocator<float>_>::size
                    ((vector<float,_std::allocator<float>_> *)(local_10 + 0xa6d0));
  local_34 = (int)sVar5;
  if (local_34 == 0) {
    whisper_log_internal
              (GGML_LOG_LEVEL_ERROR,"%s: no signal data available\n",
               "whisper_exp_compute_token_level_timestamps");
  }
  else {
    local_40 = local_28->t0;
    local_48 = local_28->t1;
    sVar5 = std::vector<whisper_token_data,_std::allocator<whisper_token_data>_>::size(local_30);
    lVar7 = local_40;
    local_4c = (int)sVar5;
    if (local_4c != 0) {
      if (local_4c == 1) {
        pvVar6 = std::vector<whisper_token_data,_std::allocator<whisper_token_data>_>::operator[]
                           (local_30,0);
        lVar2 = local_48;
        pvVar6->t0 = lVar7;
        pvVar6 = std::vector<whisper_token_data,_std::allocator<whisper_token_data>_>::operator[]
                           (local_30,0);
        pvVar6->t1 = lVar2;
      }
      else {
        local_58 = (long *)(local_10 + 0xa6b8);
        local_60 = (long *)(local_10 + 0xa6c0);
        local_68 = (int *)(local_10 + 0xa6c8);
        for (local_6c = 0; lVar7 = local_48, local_6c < local_4c; local_6c = local_6c + 1) {
          local_78 = std::vector<whisper_token_data,_std::allocator<whisper_token_data>_>::
                     operator[](local_30,(long)local_6c);
          if (local_6c == 0) {
            iVar4 = local_78->id;
            wVar3 = whisper_token_beg(local_8);
            lVar7 = local_40;
            if (iVar4 == wVar3) {
              pvVar6 = std::vector<whisper_token_data,_std::allocator<whisper_token_data>_>::
                       operator[](local_30,(long)local_6c);
              lVar2 = local_40;
              pvVar6->t0 = lVar7;
              pvVar6 = std::vector<whisper_token_data,_std::allocator<whisper_token_data>_>::
                       operator[](local_30,(long)local_6c);
              lVar7 = local_40;
              pvVar6->t1 = lVar2;
              pvVar6 = std::vector<whisper_token_data,_std::allocator<whisper_token_data>_>::
                       operator[](local_30,(long)(local_6c + 1));
              pvVar6->t0 = lVar7;
              *local_58 = local_40;
              *local_60 = local_40;
              wVar3 = whisper_token_beg(local_8);
              *local_68 = wVar3;
            }
            else {
              lVar7 = *local_60;
              pvVar6 = std::vector<whisper_token_data,_std::allocator<whisper_token_data>_>::
                       operator[](local_30,(long)local_6c);
              pvVar6->t0 = lVar7;
            }
          }
          lVar7 = *local_58;
          iVar4 = local_78->tid;
          wVar3 = whisper_token_beg(local_8);
          local_80 = lVar7 + (iVar4 - wVar3) * 2;
          wVar3 = local_78->id;
          pvVar6 = std::vector<whisper_token_data,_std::allocator<whisper_token_data>_>::operator[]
                             (local_30,(long)local_6c);
          pvVar6->id = wVar3;
          wVar3 = local_78->tid;
          pvVar6 = std::vector<whisper_token_data,_std::allocator<whisper_token_data>_>::operator[]
                             (local_30,(long)local_6c);
          pvVar6->tid = wVar3;
          fVar14 = local_78->p;
          pvVar6 = std::vector<whisper_token_data,_std::allocator<whisper_token_data>_>::operator[]
                             (local_30,(long)local_6c);
          pvVar6->p = fVar14;
          fVar14 = local_78->pt;
          pvVar6 = std::vector<whisper_token_data,_std::allocator<whisper_token_data>_>::operator[]
                             (local_30,(long)local_6c);
          pvVar6->pt = fVar14;
          fVar14 = local_78->ptsum;
          pvVar6 = std::vector<whisper_token_data,_std::allocator<whisper_token_data>_>::operator[]
                             (local_30,(long)local_6c);
          pvVar6->ptsum = fVar14;
          whisper_token_to_str
                    ((whisper_context *)
                     CONCAT17(in_stack_fffffffffffffd97,in_stack_fffffffffffffd90),
                     (whisper_token)((ulong)in_stack_fffffffffffffd88 >> 0x20));
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    (in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8,
                     (allocator<char> *)
                     CONCAT17(in_stack_fffffffffffffdc7,in_stack_fffffffffffffdc0));
          fVar14 = voice_length((string *)
                                CONCAT17(in_stack_fffffffffffffdb7,in_stack_fffffffffffffdb0));
          pvVar6 = std::vector<whisper_token_data,_std::allocator<whisper_token_data>_>::operator[]
                             (local_30,(long)local_6c);
          pvVar6->vlen = fVar14;
          std::__cxx11::string::~string(local_a0);
          std::allocator<char>::~allocator(&local_a1);
          lVar7 = local_80;
          if ((((local_18 < local_78->pt) && (local_1c < local_78->ptsum)) &&
              (*local_68 < local_78->tid)) && (local_80 <= local_48)) {
            if (0 < local_6c) {
              pvVar6 = std::vector<whisper_token_data,_std::allocator<whisper_token_data>_>::
                       operator[](local_30,(long)(local_6c + -1));
              pvVar6->t1 = lVar7;
            }
            lVar7 = local_80;
            pvVar6 = std::vector<whisper_token_data,_std::allocator<whisper_token_data>_>::
                     operator[](local_30,(long)local_6c);
            pvVar6->t0 = lVar7;
            *local_68 = local_78->tid;
          }
        }
        pvVar6 = std::vector<whisper_token_data,_std::allocator<whisper_token_data>_>::operator[]
                           (local_30,(long)(local_4c + -2));
        lVar2 = local_48;
        pvVar6->t1 = lVar7;
        pvVar6 = std::vector<whisper_token_data,_std::allocator<whisper_token_data>_>::operator[]
                           (local_30,(long)(local_4c + -1));
        lVar7 = local_48;
        pvVar6->t0 = lVar2;
        pvVar6 = std::vector<whisper_token_data,_std::allocator<whisper_token_data>_>::operator[]
                           (local_30,(long)(local_4c + -1));
        pvVar6->t1 = lVar7;
        *local_60 = local_48;
        local_b8 = 0;
        local_bc = local_b8;
        do {
          while( true ) {
            bVar13 = false;
            if (local_bc < local_4c) {
              pvVar6 = std::vector<whisper_token_data,_std::allocator<whisper_token_data>_>::
                       operator[](local_30,(long)local_bc);
              bVar13 = pvVar6->t1 < 0;
            }
            if (!bVar13) break;
            local_bc = local_bc + 1;
          }
          if (local_4c <= local_bc) {
            local_bc = local_bc + -1;
          }
          if (local_b8 < local_bc) {
            local_c8 = 0.0;
            for (local_cc = local_b8; local_cc <= local_bc; local_cc = local_cc + 1) {
              pvVar6 = std::vector<whisper_token_data,_std::allocator<whisper_token_data>_>::
                       operator[](local_30,(long)local_cc);
              local_c8 = (double)pvVar6->vlen + local_c8;
            }
            pvVar6 = std::vector<whisper_token_data,_std::allocator<whisper_token_data>_>::
                     operator[](local_30,(long)local_bc);
            lVar7 = pvVar6->t1;
            pvVar6 = std::vector<whisper_token_data,_std::allocator<whisper_token_data>_>::
                     operator[](local_30,(long)local_b8);
            local_d8 = (double)(lVar7 - pvVar6->t0);
            iVar4 = local_b8;
            while (local_dc = iVar4 + 1, local_dc <= local_bc) {
              pvVar6 = std::vector<whisper_token_data,_std::allocator<whisper_token_data>_>::
                       operator[](local_30,(long)iVar4);
              dVar1 = local_d8;
              lVar7 = pvVar6->t0;
              pvVar6 = std::vector<whisper_token_data,_std::allocator<whisper_token_data>_>::
                       operator[](local_30,(long)(local_dc + -1));
              local_e8 = (double)lVar7 + (dVar1 * (double)pvVar6->vlen) / local_c8;
              lVar7 = (long)local_e8;
              pvVar6 = std::vector<whisper_token_data,_std::allocator<whisper_token_data>_>::
                       operator[](local_30,(long)(local_dc + -1));
              pvVar6->t1 = lVar7;
              lVar7 = (long)local_e8;
              pvVar6 = std::vector<whisper_token_data,_std::allocator<whisper_token_data>_>::
                       operator[](local_30,(long)local_dc);
              pvVar6->t0 = lVar7;
              iVar4 = local_dc;
            }
          }
          local_bc = local_bc + 1;
          local_b8 = local_bc;
        } while (local_bc < local_4c);
        for (local_ec = 0; local_ec < local_4c + -1; local_ec = local_ec + 1) {
          pvVar6 = std::vector<whisper_token_data,_std::allocator<whisper_token_data>_>::operator[]
                             (local_30,(long)local_ec);
          if (pvVar6->t1 < 0) {
            pvVar6 = std::vector<whisper_token_data,_std::allocator<whisper_token_data>_>::
                     operator[](local_30,(long)local_ec);
            iVar12 = pvVar6->t1;
            pvVar6 = std::vector<whisper_token_data,_std::allocator<whisper_token_data>_>::
                     operator[](local_30,(long)(local_ec + 1));
            pvVar6->t0 = iVar12;
          }
          if (0 < local_ec) {
            pvVar6 = std::vector<whisper_token_data,_std::allocator<whisper_token_data>_>::
                     operator[](local_30,(long)(local_ec + -1));
            lVar7 = pvVar6->t1;
            pvVar6 = std::vector<whisper_token_data,_std::allocator<whisper_token_data>_>::
                     operator[](local_30,(long)local_ec);
            if (pvVar6->t0 < lVar7) {
              pvVar6 = std::vector<whisper_token_data,_std::allocator<whisper_token_data>_>::
                       operator[](local_30,(long)(local_ec + -1));
              iVar12 = pvVar6->t1;
              pvVar6 = std::vector<whisper_token_data,_std::allocator<whisper_token_data>_>::
                       operator[](local_30,(long)local_ec);
              pvVar6->t0 = iVar12;
              pvVar6 = std::vector<whisper_token_data,_std::allocator<whisper_token_data>_>::
                       operator[](local_30,(long)local_ec);
              pvVar8 = std::vector<whisper_token_data,_std::allocator<whisper_token_data>_>::
                       operator[](local_30,(long)local_ec);
              plVar9 = std::max<long>(&pvVar6->t0,&pvVar8->t1);
              lVar7 = *plVar9;
              pvVar6 = std::vector<whisper_token_data,_std::allocator<whisper_token_data>_>::
                       operator[](local_30,(long)local_ec);
              pvVar6->t1 = lVar7;
            }
          }
        }
        local_f0 = 2000;
        for (local_f4 = 0; local_f4 < local_4c; local_f4 = local_f4 + 1) {
          pvVar6 = std::vector<whisper_token_data,_std::allocator<whisper_token_data>_>::operator[]
                             (local_30,(long)local_f4);
          iVar4 = pvVar6->id;
          wVar3 = whisper_token_eot(local_8);
          if (iVar4 < wVar3) {
            std::vector<whisper_token_data,_std::allocator<whisper_token_data>_>::operator[]
                      (local_30,(long)local_f4);
            local_f8 = timestamp_to_sample(CONCAT17(in_stack_fffffffffffffd97,
                                                    in_stack_fffffffffffffd90),
                                           (int)((ulong)in_stack_fffffffffffffd88 >> 0x20));
            std::vector<whisper_token_data,_std::allocator<whisper_token_data>_>::operator[]
                      (local_30,(long)local_f4);
            local_fc = timestamp_to_sample(CONCAT17(in_stack_fffffffffffffd97,
                                                    in_stack_fffffffffffffd90),
                                           (int)((ulong)in_stack_fffffffffffffd88 >> 0x20));
            local_104 = local_f8 + -2000;
            local_108 = 0;
            piVar10 = std::max<int>(&local_104,&local_108);
            local_100 = *piVar10;
            local_110 = local_fc + 2000;
            piVar10 = std::min<int>(&local_110,&local_34);
            local_10c = *piVar10;
            iVar4 = local_10c - local_100;
            local_118 = 0.0;
            for (local_11c = local_100; local_11c < local_10c; local_11c = local_11c + 1) {
              pvVar11 = std::vector<float,_std::allocator<float>_>::operator[]
                                  ((vector<float,_std::allocator<float>_> *)(local_10 + 0xa6d0),
                                   (long)local_11c);
              local_118 = *pvVar11 + local_118;
            }
            fVar14 = (local_118 * 0.5) / (float)iVar4;
            local_124 = local_f8;
            pvVar11 = std::vector<float,_std::allocator<float>_>::operator[]
                                ((vector<float,_std::allocator<float>_> *)(local_10 + 0xa6d0),
                                 (long)local_f8);
            if ((*pvVar11 <= fVar14) || (local_f4 < 1)) {
              for (; pvVar11 = std::vector<float,_std::allocator<float>_>::operator[]
                                         ((vector<float,_std::allocator<float>_> *)
                                          (local_10 + 0xa6d0),(long)local_124),
                  *pvVar11 < fVar14 && local_124 < local_fc; local_124 = local_124 + 1) {
              }
              local_f8 = local_124;
              iVar12 = sample_to_timestamp(local_124);
              pvVar6 = std::vector<whisper_token_data,_std::allocator<whisper_token_data>_>::
                       operator[](local_30,(long)local_f4);
              pvVar6->t0 = iVar12;
            }
            else {
              while( true ) {
                bVar13 = false;
                if (0 < local_124) {
                  pvVar11 = std::vector<float,_std::allocator<float>_>::operator[]
                                      ((vector<float,_std::allocator<float>_> *)(local_10 + 0xa6d0),
                                       (long)local_124);
                  bVar13 = fVar14 < *pvVar11;
                }
                if (!bVar13) break;
                local_124 = local_124 + -1;
              }
              iVar12 = sample_to_timestamp(local_124);
              pvVar6 = std::vector<whisper_token_data,_std::allocator<whisper_token_data>_>::
                       operator[](local_30,(long)local_f4);
              pvVar6->t0 = iVar12;
              pvVar6 = std::vector<whisper_token_data,_std::allocator<whisper_token_data>_>::
                       operator[](local_30,(long)local_f4);
              lVar7 = pvVar6->t0;
              pvVar6 = std::vector<whisper_token_data,_std::allocator<whisper_token_data>_>::
                       operator[](local_30,(long)(local_f4 + -1));
              if (lVar7 < pvVar6->t1) {
                pvVar6 = std::vector<whisper_token_data,_std::allocator<whisper_token_data>_>::
                         operator[](local_30,(long)(local_f4 + -1));
                iVar12 = pvVar6->t1;
                pvVar6 = std::vector<whisper_token_data,_std::allocator<whisper_token_data>_>::
                         operator[](local_30,(long)local_f4);
                pvVar6->t0 = iVar12;
              }
              else {
                local_f8 = local_124;
              }
            }
            local_128 = local_fc;
            pvVar11 = std::vector<float,_std::allocator<float>_>::operator[]
                                ((vector<float,_std::allocator<float>_> *)(local_10 + 0xa6d0),
                                 (long)local_fc);
            if (*pvVar11 <= fVar14) {
              while( true ) {
                pvVar11 = std::vector<float,_std::allocator<float>_>::operator[]
                                    ((vector<float,_std::allocator<float>_> *)(local_10 + 0xa6d0),
                                     (long)local_128);
                in_stack_fffffffffffffd97 = *pvVar11 < fVar14 && local_f8 < local_128;
                if (*pvVar11 >= fVar14 || local_f8 >= local_128) break;
                local_128 = local_128 + -1;
              }
              local_fc = local_128;
              in_stack_fffffffffffffd88 = sample_to_timestamp(local_128);
              pvVar6 = std::vector<whisper_token_data,_std::allocator<whisper_token_data>_>::
                       operator[](local_30,(long)local_f4);
              pvVar6->t1 = in_stack_fffffffffffffd88;
            }
            else {
              while( true ) {
                bVar13 = false;
                if (local_128 < local_34 + -1) {
                  pvVar11 = std::vector<float,_std::allocator<float>_>::operator[]
                                      ((vector<float,_std::allocator<float>_> *)(local_10 + 0xa6d0),
                                       (long)local_128);
                  bVar13 = fVar14 < *pvVar11;
                }
                if (!bVar13) break;
                local_128 = local_128 + 1;
              }
              iVar12 = sample_to_timestamp(local_128);
              pvVar6 = std::vector<whisper_token_data,_std::allocator<whisper_token_data>_>::
                       operator[](local_30,(long)local_f4);
              pvVar6->t1 = iVar12;
              if (local_f4 < local_4c + -1) {
                pvVar6 = std::vector<whisper_token_data,_std::allocator<whisper_token_data>_>::
                         operator[](local_30,(long)local_f4);
                lVar7 = pvVar6->t1;
                pvVar6 = std::vector<whisper_token_data,_std::allocator<whisper_token_data>_>::
                         operator[](local_30,(long)(local_f4 + 1));
                if (pvVar6->t0 < lVar7) {
                  pvVar6 = std::vector<whisper_token_data,_std::allocator<whisper_token_data>_>::
                           operator[](local_30,(long)(local_f4 + 1));
                  iVar12 = pvVar6->t0;
                  pvVar6 = std::vector<whisper_token_data,_std::allocator<whisper_token_data>_>::
                           operator[](local_30,(long)local_f4);
                  pvVar6->t1 = iVar12;
                  goto LAB_001fcf03;
                }
              }
              local_fc = local_128;
            }
          }
LAB_001fcf03:
        }
      }
    }
  }
  return;
}

Assistant:

static void whisper_exp_compute_token_level_timestamps(
        struct whisper_context & ctx,
          struct whisper_state & state,
                           int   i_segment,
                         float   thold_pt,
                         float   thold_ptsum) {
    auto & segment = state.result_all[i_segment];
    auto & tokens  = segment.tokens;

    const int n_samples = state.energy.size();

    if (n_samples == 0) {
        WHISPER_LOG_ERROR("%s: no signal data available\n", __func__);
        return;
    }

    const int64_t t0 = segment.t0;
    const int64_t t1 = segment.t1;

    const int n = tokens.size();

    if (n == 0) {
        return;
    }

    if (n == 1) {
        tokens[0].t0 = t0;
        tokens[0].t1 = t1;

        return;
    }

    auto & t_beg    = state.t_beg;
    auto & t_last   = state.t_last;
    auto & tid_last = state.tid_last;

    for (int j = 0; j < n; ++j) {
        auto & token = tokens[j];

        if (j == 0) {
            if (token.id == whisper_token_beg(&ctx)) {
                tokens[j    ].t0 = t0;
                tokens[j    ].t1 = t0;
                tokens[j + 1].t0 = t0;

                t_beg    = t0;
                t_last   = t0;
                tid_last = whisper_token_beg(&ctx);
            } else {
                tokens[j    ].t0 = t_last;
            }
        }

        const int64_t tt = t_beg + 2*(token.tid - whisper_token_beg(&ctx));

        tokens[j].id    = token.id;
        tokens[j].tid   = token.tid;
        tokens[j].p     = token.p;
        tokens[j].pt    = token.pt;
        tokens[j].ptsum = token.ptsum;

        tokens[j].vlen = voice_length(whisper_token_to_str(&ctx, token.id));

        if (token.pt > thold_pt && token.ptsum > thold_ptsum && token.tid > tid_last && tt <= t1) {
            if (j > 0) {
                tokens[j - 1].t1 = tt;
            }
            tokens[j].t0 = tt;
            tid_last = token.tid;
        }
    }

    tokens[n - 2].t1 = t1;
    tokens[n - 1].t0 = t1;
    tokens[n - 1].t1 = t1;

    t_last = t1;

    // find intervals of tokens with unknown timestamps
    // fill the timestamps by proportionally splitting the interval based on the token voice lengths
    {
        int p0 = 0;
        int p1 = 0;

        while (true) {
            while (p1 < n && tokens[p1].t1 < 0) {
                p1++;
            }

            if (p1 >= n) {
                p1--;
            }

            //printf("p0=%d p1=%d t0=%lld t1=%lld\n", p0, p1, tokens[p0].t0, tokens[p1].t1);

            if (p1 > p0) {
                double psum = 0.0;
                for (int j = p0; j <= p1; j++) {
                    psum += tokens[j].vlen;
                }

                //printf("analyzing %d - %d, psum = %f\n", p0, p1, psum);

                const double dt = tokens[p1].t1 - tokens[p0].t0;

                // split the time proportionally to the voice length
                for (int j = p0 + 1; j <= p1; j++) {
                    const double ct = tokens[j - 1].t0 + dt*tokens[j - 1].vlen/psum;

                    tokens[j - 1].t1 = ct;
                    tokens[j    ].t0 = ct;
                }
            }

            p1++;
            p0 = p1;
            if (p1 >= n) {
                break;
            }
        }
    }

    // fix up (just in case)
    for (int j = 0; j < n - 1; j++) {
        if (tokens[j].t1 < 0) {
            tokens[j + 1].t0 = tokens[j].t1;
        }

        if (j > 0) {
            if (tokens[j - 1].t1 > tokens[j].t0) {
                tokens[j].t0 = tokens[j - 1].t1;
                tokens[j].t1 = std::max(tokens[j].t0, tokens[j].t1);
            }
        }
    }

    // VAD
    // expand or contract tokens based on voice activity
    {
        const int hw = WHISPER_SAMPLE_RATE/8;

        for (int j = 0; j < n; j++) {
            if (tokens[j].id >= whisper_token_eot(&ctx)) {
                continue;
            }

            int s0 = timestamp_to_sample(tokens[j].t0, n_samples);
            int s1 = timestamp_to_sample(tokens[j].t1, n_samples);

            const int ss0 = std::max(s0 - hw, 0);
            const int ss1 = std::min(s1 + hw, n_samples);

            const int ns = ss1 - ss0;

            float sum = 0.0f;

            for (int k = ss0; k < ss1; k++) {
                sum += state.energy[k];
            }

            const float thold = 0.5*sum/ns;

            {
                int k = s0;
                if (state.energy[k] > thold && j > 0) {
                    while (k > 0 && state.energy[k] > thold) {
                        k--;
                    }
                    tokens[j].t0 = sample_to_timestamp(k);
                    if (tokens[j].t0 < tokens[j - 1].t1) {
                        tokens[j].t0 = tokens[j - 1].t1;
                    } else {
                        s0 = k;
                    }
                } else {
                    while (state.energy[k] < thold && k < s1) {
                        k++;
                    }
                    s0 = k;
                    tokens[j].t0 = sample_to_timestamp(k);
                }
            }

            {
                int k = s1;
                if (state.energy[k] > thold) {
                    while (k < n_samples - 1 && state.energy[k] > thold) {
                        k++;
                    }
                    tokens[j].t1 = sample_to_timestamp(k);
                    if (j < n - 1 && tokens[j].t1 > tokens[j + 1].t0) {
                        tokens[j].t1 = tokens[j + 1].t0;
                    } else {
                        s1 = k;
                    }
                } else {
                    while (state.energy[k] < thold && k > s0) {
                        k--;
                    }
                    s1 = k;
                    tokens[j].t1 = sample_to_timestamp(k);
                }
            }
        }
    }

    // fixed token expand (optional)
    //{
    //    const int t_expand = 0;

    //    for (int j = 0; j < n; j++) {
    //        if (j > 0) {
    //            tokens[j].t0 = std::max(0, (int) (tokens[j].t0 - t_expand));
    //        }
    //        if (j < n - 1) {
    //            tokens[j].t1 = tokens[j].t1 + t_expand;
    //        }
    //    }
    //}

    // debug info
    //for (int j = 0; j < n; ++j) {
    //    const auto & token = tokens[j];
    //    const auto tt = token.pt > thold_pt && token.ptsum > 0.01 ? whisper_token_to_str(&ctx, token.tid) : "[?]";
    //    printf("%s: %10s %6.3f %6.3f %6.3f %6.3f %5d %5d '%s'\n", __func__,
    //            tt, token.p, token.pt, token.ptsum, token.vlen, (int) token.t0, (int) token.t1, whisper_token_to_str(&ctx, token.id));

    //    if (tokens[j].id >= whisper_token_eot(&ctx)) {
    //        continue;
    //    }
    //}
}